

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  uint uVar1;
  FIELD *field;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  int local_a58;
  int local_a54;
  char local_a48 [8];
  char pageLine [512];
  char fmt [512];
  char *toggleKeyInstruction;
  char thirdLine [512];
  char secondLine [512];
  char firstLine [512];
  char fmt_s [3];
  FIELD *currentField;
  cmCursesWidget *cw;
  int y;
  int x;
  int process_local;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_a54 = -1;
    local_a58 = -1;
  }
  else {
    local_a54 = *(short *)(_stdscr + 4) + 1;
    local_a58 = *(short *)(_stdscr + 6) + 1;
  }
  if (((0x40 < local_a58) && (this->InitialWidth <= local_a58)) && (5 < local_a54)) {
    currentField = (FIELD *)0x0;
    if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
      field = current_field((this->super_cmCursesForm).Form);
      currentField = (FIELD *)field_userptr(field);
    }
    firstLine[0x1fd] = '%';
    firstLine[0x1fe] = 's';
    firstLine[0x1ff] = '\0';
    if ((currentField == (FIELD *)0x0) ||
       (uVar2 = (**(code **)(*(long *)currentField + 0x30))(), (uVar2 & 1) == 0)) {
      memset(secondLine + 0x1f8,0,0x200);
      memset(thirdLine + 0x1f8,0,0x200);
      memset(&toggleKeyInstruction,0,0x200);
      if (process == 0) {
        if ((this->OkToGenerate & 1U) == 0) {
          sprintf(secondLine + 0x1f8,"Press [c] to configure                                     ");
        }
        else {
          sprintf(secondLine + 0x1f8,"Press [c] to configure       Press [g] to generate and exit");
        }
        pcVar4 = "Off";
        if ((this->AdvancedMode & 1U) != 0) {
          pcVar4 = "On";
        }
        sprintf((char *)&toggleKeyInstruction,"Press [t] to toggle advanced mode (Currently %s)",
                pcVar4);
        sprintf(thirdLine + 0x1f8,
                "Press [h] for help           Press [q] to quit without generating");
      }
      else {
        memset(secondLine + 0x1f8,0x20,0x44);
        memset(thirdLine + 0x1f8,0x20,0x44);
        memset(&toggleKeyInstruction,0x20,0x44);
      }
      curses_move(local_a54 - 4,0);
      memcpy(pageLine + 0x1f8,"Press [enter] to edit option Press [d] to delete an entry",0x200);
      if (process != 0) {
        memset(pageLine + 0x1f8,0x20,0x1b);
      }
      printw(firstLine + 0x1fd);
      curses_move(local_a54 - 3,0);
      printw(firstLine + 0x1fd);
      curses_move(local_a54 - 2,0);
      printw(firstLine + 0x1fd);
      curses_move(local_a54 - 1,0);
      printw(firstLine + 0x1fd);
    }
    if (currentField != (FIELD *)0x0) {
      memset(local_a48,0,0x200);
      uVar1 = cmCursesWidget::GetPage((cmCursesWidget *)currentField);
      sprintf(local_a48,"Page %d of %d",(ulong)uVar1,(ulong)(uint)this->NumberOfPages);
      sVar3 = strlen(local_a48);
      curses_move(0,0x40 - (int)sVar3);
      printw(firstLine + 0x1fd,local_a48);
    }
    pos_form_cursor((this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = nullptr;
  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
  }

  char fmt_s[] = "%s";
  if (cw == nullptr || !cw->PrintKeys()) {
    char firstLine[512] = "";
    char secondLine[512] = "";
    char thirdLine[512] = "";
    if (process) {
      memset(firstLine, ' ', 68);
      memset(secondLine, ' ', 68);
      memset(thirdLine, ' ', 68);
    } else {
      if (this->OkToGenerate) {
        sprintf(firstLine,
                "Press [c] to configure       Press [g] to generate and exit");
      } else {
        sprintf(firstLine,
                "Press [c] to configure                                     ");
      }
      {
        const char* toggleKeyInstruction =
          "Press [t] to toggle advanced mode (Currently %s)";
        sprintf(thirdLine, toggleKeyInstruction,
                this->AdvancedMode ? "On" : "Off");
      }
      sprintf(secondLine,
              "Press [h] for help           "
              "Press [q] to quit without generating");
    }

    curses_move(y - 4, 0);
    char fmt[512] =
      "Press [enter] to edit option Press [d] to delete an entry";
    if (process) {
      memset(fmt, ' ', 27);
    }
    printw(fmt_s, fmt);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, secondLine);
    curses_move(y - 1, 0);
    printw(fmt_s, thirdLine);
  }

  if (cw) {
    char pageLine[512] = "";
    sprintf(pageLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0, 65 - static_cast<unsigned int>(strlen(pageLine)) - 1);
    printw(fmt_s, pageLine);
  }

  pos_form_cursor(this->Form);
}